

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.h
# Opt level: O0

long Clasp::compare_and_swap<long>(atomic<long> *in,long oldVal,long newVal)

{
  memory_order mVar1;
  long lVar2;
  long in_RDX;
  long in_RSI;
  long *in_RDI;
  bool bVar3;
  undefined8 in_stack_fffffffffffffe70;
  long local_60 [2];
  undefined4 local_4c;
  long *local_40;
  
  local_40 = local_60;
  local_4c = 5;
  local_60[0] = in_RSI;
  mVar1 = std::__cmpexch_failure_order((memory_order)((ulong)in_stack_fffffffffffffe70 >> 0x20));
  switch(0x1b6c94) {
  default:
    if (mVar1 - memory_order_consume < 2) {
      LOCK();
      lVar2 = *in_RDI;
      bVar3 = local_60[0] == lVar2;
      if (bVar3) {
        *in_RDI = in_RDX;
        lVar2 = local_60[0];
      }
      UNLOCK();
      if (!bVar3) {
        local_60[0] = lVar2;
      }
    }
    else if (mVar1 == memory_order_seq_cst) {
      LOCK();
      lVar2 = *in_RDI;
      bVar3 = local_60[0] == lVar2;
      if (bVar3) {
        *in_RDI = in_RDX;
        lVar2 = local_60[0];
      }
      UNLOCK();
      if (!bVar3) {
        local_60[0] = lVar2;
      }
    }
    else {
      LOCK();
      lVar2 = *in_RDI;
      bVar3 = local_60[0] == lVar2;
      if (bVar3) {
        *in_RDI = in_RDX;
        lVar2 = local_60[0];
      }
      UNLOCK();
      if (!bVar3) {
        local_60[0] = lVar2;
      }
    }
    break;
  case 2:
    if (mVar1 - memory_order_consume < 2) {
      LOCK();
      lVar2 = *in_RDI;
      bVar3 = local_60[0] == lVar2;
      if (bVar3) {
        *in_RDI = in_RDX;
        lVar2 = local_60[0];
      }
      UNLOCK();
      if (!bVar3) {
        local_60[0] = lVar2;
      }
    }
    else if (mVar1 == memory_order_seq_cst) {
      LOCK();
      lVar2 = *in_RDI;
      bVar3 = local_60[0] == lVar2;
      if (bVar3) {
        *in_RDI = in_RDX;
        lVar2 = local_60[0];
      }
      UNLOCK();
      if (!bVar3) {
        local_60[0] = lVar2;
      }
    }
    else {
      LOCK();
      lVar2 = *in_RDI;
      bVar3 = local_60[0] == lVar2;
      if (bVar3) {
        *in_RDI = in_RDX;
        lVar2 = local_60[0];
      }
      UNLOCK();
      if (!bVar3) {
        local_60[0] = lVar2;
      }
    }
    break;
  case 3:
    if (mVar1 - memory_order_consume < 2) {
      LOCK();
      lVar2 = *in_RDI;
      bVar3 = local_60[0] == lVar2;
      if (bVar3) {
        *in_RDI = in_RDX;
        lVar2 = local_60[0];
      }
      UNLOCK();
      if (!bVar3) {
        local_60[0] = lVar2;
      }
    }
    else if (mVar1 == memory_order_seq_cst) {
      LOCK();
      lVar2 = *in_RDI;
      bVar3 = local_60[0] == lVar2;
      if (bVar3) {
        *in_RDI = in_RDX;
        lVar2 = local_60[0];
      }
      UNLOCK();
      if (!bVar3) {
        local_60[0] = lVar2;
      }
    }
    else {
      LOCK();
      lVar2 = *in_RDI;
      bVar3 = local_60[0] == lVar2;
      if (bVar3) {
        *in_RDI = in_RDX;
        lVar2 = local_60[0];
      }
      UNLOCK();
      if (!bVar3) {
        local_60[0] = lVar2;
      }
    }
    break;
  case 4:
    if (mVar1 - memory_order_consume < 2) {
      LOCK();
      lVar2 = *in_RDI;
      bVar3 = local_60[0] == lVar2;
      if (bVar3) {
        *in_RDI = in_RDX;
        lVar2 = local_60[0];
      }
      UNLOCK();
      if (!bVar3) {
        local_60[0] = lVar2;
      }
    }
    else if (mVar1 == memory_order_seq_cst) {
      LOCK();
      lVar2 = *in_RDI;
      bVar3 = local_60[0] == lVar2;
      if (bVar3) {
        *in_RDI = in_RDX;
        lVar2 = local_60[0];
      }
      UNLOCK();
      if (!bVar3) {
        local_60[0] = lVar2;
      }
    }
    else {
      LOCK();
      lVar2 = *in_RDI;
      bVar3 = local_60[0] == lVar2;
      if (bVar3) {
        *in_RDI = in_RDX;
        lVar2 = local_60[0];
      }
      UNLOCK();
      if (!bVar3) {
        local_60[0] = lVar2;
      }
    }
  }
  return local_60[0];
}

Assistant:

T compare_and_swap(std::atomic<T>& in, T oldVal, T newVal) {
	in.compare_exchange_strong(oldVal, newVal);
	return oldVal;
}